

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_2::IsTypeNullable
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *instruction,
               ValidationState_t *_)

{
  ValidationState_t *pVVar1;
  bool bVar2;
  uint uVar3;
  const_reference pvVar4;
  Instruction *pIVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  bool local_45;
  Instruction *element;
  size_t elementIndex;
  Instruction *base_type;
  uint16_t word_count;
  ValidationState_t *pVStack_20;
  uint16_t opcode;
  ValidationState_t *__local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *instruction_local;
  
  pVStack_20 = _;
  __local = (ValidationState_t *)instruction;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](instruction,0);
  spvOpcodeSplit(*pvVar4,(uint16_t *)((long)&base_type + 4),(uint16_t *)((long)&base_type + 6));
  pVVar1 = pVStack_20;
  uVar3 = (uint)base_type._6_2_;
  if (uVar3 - 0x14 < 3) {
LAB_0027f928:
    instruction_local._7_1_ = true;
  }
  else {
    if ((uVar3 - 0x17 < 2) || (uVar3 == 0x1c)) {
LAB_0027f931:
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__local,2);
      pIVar5 = ValidationState_t::FindDef(pVVar1,*pvVar4);
      local_45 = false;
      if (pIVar5 != (Instruction *)0x0) {
        pvVar6 = Instruction::words(pIVar5);
        local_45 = IsTypeNullable(pvVar6,pVStack_20);
      }
      return local_45;
    }
    if (uVar3 == 0x1e) {
      element = (Instruction *)0x2;
      while( true ) {
        pIVar5 = (Instruction *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__local);
        pVVar1 = pVStack_20;
        if (pIVar5 <= element) {
          return true;
        }
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__local,
                            (size_type)element);
        pIVar5 = ValidationState_t::FindDef(pVVar1,*pvVar4);
        if (pIVar5 == (Instruction *)0x0) break;
        pvVar6 = Instruction::words(pIVar5);
        bVar2 = IsTypeNullable(pvVar6,pVStack_20);
        if (!bVar2) {
          return false;
        }
        element = (Instruction *)
                  ((long)&(element->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
      }
      return false;
    }
    if (uVar3 != 0x20) {
      if (uVar3 - 0x22 < 4) goto LAB_0027f928;
      if (uVar3 != 0x1141) {
        if ((uVar3 != 0x1168) && (uVar3 != 0x14ee)) {
          return false;
        }
        goto LAB_0027f931;
      }
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__local,2);
    if (*pvVar4 == 0x14e5) {
      instruction_local._7_1_ = false;
    }
    else {
      instruction_local._7_1_ = true;
    }
  }
  return instruction_local._7_1_;
}

Assistant:

bool IsTypeNullable(const std::vector<uint32_t>& instruction,
                    const ValidationState_t& _) {
  uint16_t opcode;
  uint16_t word_count;
  spvOpcodeSplit(instruction[0], &word_count, &opcode);
  switch (static_cast<spv::Op>(opcode)) {
    case spv::Op::OpTypeBool:
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
    case spv::Op::OpTypeEvent:
    case spv::Op::OpTypeDeviceEvent:
    case spv::Op::OpTypeReserveId:
    case spv::Op::OpTypeQueue:
      return true;
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
    case spv::Op::OpTypeVector: {
      auto base_type = _.FindDef(instruction[2]);
      return base_type && IsTypeNullable(base_type->words(), _);
    }
    case spv::Op::OpTypeStruct: {
      for (size_t elementIndex = 2; elementIndex < instruction.size();
           ++elementIndex) {
        auto element = _.FindDef(instruction[elementIndex]);
        if (!element || !IsTypeNullable(element->words(), _)) return false;
      }
      return true;
    }
    case spv::Op::OpTypeUntypedPointerKHR:
    case spv::Op::OpTypePointer:
      if (spv::StorageClass(instruction[2]) ==
          spv::StorageClass::PhysicalStorageBuffer) {
        return false;
      }
      return true;
    default:
      return false;
  }
}